

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

void substitute_args(List *argval,List *argname,List *expr)

{
  TokenType TVar1;
  ListStruct *pLVar2;
  ListStruct *pLVar3;
  anon_union_8_7_0ba269be_for_u aVar4;
  char *pcVar5;
  unsigned_long uVar6;
  undefined4 uVar7;
  BOOL BVar8;
  List *pLVar9;
  ListStruct *ls;
  ListStruct *pLVar10;
  ListStruct *pLVar11;
  ListStruct *pLVar12;
  
  ls = argval;
  for (pLVar11 = argname; pLVar11 != (List *)0x0; pLVar11 = pLVar11->cdr) {
    if ((pLVar11->token).type == TOK_TAIL) goto LAB_00108394;
    ls = ls->cdr;
  }
  ls = (List *)0x0;
LAB_00108394:
  do {
    if (expr == (List *)0x0) {
      return;
    }
    TVar1 = (expr->token).type;
    if (TVar1 == TOK_LIST) {
      substitute_args(argval,argname,expr->car);
    }
    else if (TVar1 == TOK_TAIL) {
      if (pLVar11 == (List *)0x0) {
        parse_error(expr,"But this macro has no tail!\n");
      }
      pLVar9 = copy_list(ls);
      replace_list(expr,pLVar9);
    }
    else if (TVar1 == TOK_IDENTIFIER) {
      pLVar10 = argname;
      pLVar12 = argval;
      do {
        if ((pLVar10 == (List *)0x0) || (pLVar12 == (List *)0x0)) break;
        TVar1 = (pLVar10->token).type;
        if ((TVar1 == TOK_TAIL) || (TVar1 == TOK_IDENTIFIER)) {
          BVar8 = tokens_equal(&pLVar10->token,&expr->token);
          if (BVar8 != FALSE) {
            pLVar10 = expr->cdr;
            pLVar2 = pLVar12->cdr;
            pLVar3 = pLVar12->car;
            uVar7 = *(undefined4 *)&(pLVar12->token).field_0x4;
            aVar4 = (pLVar12->token).u;
            pcVar5 = (pLVar12->token).filename;
            uVar6 = (pLVar12->token).lineno;
            (expr->token).type = (pLVar12->token).type;
            *(undefined4 *)&(expr->token).field_0x4 = uVar7;
            (expr->token).u = aVar4;
            (expr->token).filename = pcVar5;
            (expr->token).lineno = uVar6;
            expr->cdr = pLVar2;
            expr->car = pLVar3;
            pLVar9 = copy_list(pLVar12->car);
            expr->car = pLVar9;
            expr->cdr = pLVar10;
            break;
          }
        }
        pLVar10 = pLVar10->cdr;
        pLVar12 = pLVar12->cdr;
      } while( true );
    }
    expr = expr->cdr;
  } while( true );
}

Assistant:

static void
substitute_args (const List *argval, const List *argname, List *expr)
{
  const List *name, *val, *tail = NULL;
  BOOL has_tail = FALSE;

#ifdef DEBUG
  List *original_expr = expr;

  printf ("substitute_args: ");
  printf ("argval  = ");   print_list (argval, stdout);
  printf ("\nargname = "); print_list (argname, stdout);
  printf ("\nexpr    = "); print_list (expr, stdout);
  putchar ('\n');
#endif

  /* See if there is a +tail, and make it tail point to the list of args. */
  for (name = argname, val = argval; name != NULL;
       name = name->cdr, val = val->cdr)
    if (name->token.type == TOK_TAIL)
      {
	tail = val;
	has_tail = TRUE;
	break;
      }


  for (; expr != NULL; expr = expr->cdr)
    {
      switch (expr->token.type) {
      case TOK_LIST:
	substitute_args (argval, argname, expr->car);
	break;
      case TOK_IDENTIFIER:
	for (name = argname, val = argval; name != NULL && val != NULL;
	     name = name->cdr, val = val->cdr)
	  if (!IS_LITERAL (name) && tokens_equal (&name->token, &expr->token))
	    {
	      List *tmp_cdr = expr->cdr;
	      *expr = *val;
	      expr->car = copy_list (val->car);
	      expr->cdr = tmp_cdr;
	      break;
	    }
	break;
      case TOK_TAIL:
	if (!has_tail)
	  parse_error (expr, "But this macro has no tail!\n");
	replace_list (expr, copy_list (tail));
	break;

      default: break;
      }
    }

#ifdef DEBUG
  printf ("*** expr after argument substitutions:\n");
  print_list (original_expr, stdout);
  putchar ('\n');
#endif

}